

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_utils.c
# Opt level: O1

int BuildHuffmanTable(HuffmanCode *root_table,int root_bits,int *code_lengths,int code_lengths_size,
                     uint16_t *sorted)

{
  ushort uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  HuffmanCode HVar7;
  int iVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint8_t uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  HuffmanCode *pHVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int offset [16];
  int local_f4;
  long local_d0;
  int iStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int aiStack_78 [18];
  
  bVar10 = (byte)root_bits;
  iVar6 = 1 << (bVar10 & 0x1f);
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  if (0 < code_lengths_size) {
    uVar19 = 0;
    do {
      if (0xf < (long)code_lengths[uVar19]) {
        return 0;
      }
      *(int *)(local_b8 + (long)code_lengths[uVar19] * 4) =
           *(int *)(local_b8 + (long)code_lengths[uVar19] * 4) + 1;
      uVar19 = uVar19 + 1;
    } while ((uint)code_lengths_size != uVar19);
  }
  if (local_b8._0_4_ == code_lengths_size) {
LAB_0012f3da:
    iVar6 = 0;
  }
  else {
    aiStack_78[1] = 0;
    lVar20 = 0;
    do {
      if (1 << ((char)lVar20 + 1U & 0x1f) < *(int *)(local_b8 + lVar20 * 4 + 4)) {
        return 0;
      }
      aiStack_78[lVar20 + 2] = *(int *)(local_b8 + lVar20 * 4 + 4) + aiStack_78[lVar20 + 1];
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0xe);
    if (0 < code_lengths_size) {
      uVar19 = 0;
      do {
        lVar20 = (long)code_lengths[uVar19];
        if (0 < lVar20) {
          if (sorted == (uint16_t *)0x0) {
            aiStack_78[lVar20] = aiStack_78[lVar20] + 1;
          }
          else {
            iVar11 = aiStack_78[lVar20];
            aiStack_78[lVar20] = iVar11 + 1;
            sorted[iVar11] = (uint16_t)uVar19;
          }
        }
        uVar19 = uVar19 + 1;
      } while ((uint)code_lengths_size != uVar19);
    }
    auVar5 = _DAT_001531c0;
    auVar4 = _DAT_00151c30;
    auVar3 = _DAT_00150a00;
    if (aiStack_78[0xf] == 1) {
      if (sorted != (uint16_t *)0x0) {
        HVar7 = (HuffmanCode)((uint)*sorted << 0x10);
        lVar16 = (long)iVar6;
        lVar20 = 1;
        if (1 < lVar16) {
          lVar20 = lVar16;
        }
        lVar21 = lVar20 + -1;
        auVar32._8_4_ = (int)lVar21;
        auVar32._0_8_ = lVar21;
        auVar32._12_4_ = (int)((ulong)lVar21 >> 0x20);
        pHVar17 = root_table + lVar16 + -1;
        uVar19 = 0;
        auVar32 = auVar32 ^ _DAT_00151c30;
        do {
          auVar33._8_4_ = (int)uVar19;
          auVar33._0_8_ = uVar19;
          auVar33._12_4_ = (int)(uVar19 >> 0x20);
          auVar34 = (auVar33 | auVar3) ^ auVar4;
          iVar11 = auVar32._4_4_;
          if ((bool)(~(auVar34._4_4_ == iVar11 && auVar32._0_4_ < auVar34._0_4_ ||
                      iVar11 < auVar34._4_4_) & 1)) {
            *pHVar17 = HVar7;
          }
          if ((auVar34._12_4_ != auVar32._12_4_ || auVar34._8_4_ <= auVar32._8_4_) &&
              auVar34._12_4_ <= auVar32._12_4_) {
            pHVar17[-1] = HVar7;
          }
          auVar33 = (auVar33 | auVar5) ^ auVar4;
          iVar31 = auVar33._4_4_;
          if (iVar31 <= iVar11 && (iVar31 != iVar11 || auVar33._0_4_ <= auVar32._0_4_)) {
            pHVar17[-2] = HVar7;
            pHVar17[-3] = HVar7;
          }
          uVar19 = uVar19 + 4;
          pHVar17 = pHVar17 + -4;
        } while (((int)lVar20 + 3U & 0xfffffffc) != uVar19);
      }
    }
    else {
      if (root_bits < 1) {
        iVar31 = 1;
        uVar19 = 0;
        iVar11 = 1;
        lVar20 = 0;
      }
      else {
        iVar12 = 2;
        uVar22 = 1;
        lVar20 = 0;
        iVar31 = 1;
        uVar19 = 0;
        iVar8 = 1;
        do {
          iVar11 = iVar8 * 2 - *(int *)(local_b8 + uVar22 * 4);
          if (iVar11 < 0) goto LAB_0012f3da;
          if (root_table != (HuffmanCode *)0x0) {
            iVar24 = *(int *)(local_b8 + uVar22 * 4);
            if (0 < iVar24) {
              lVar20 = (long)(int)lVar20;
              do {
                uVar1 = sorted[lVar20];
                iVar14 = iVar6;
                do {
                  iVar23 = iVar14 - iVar12;
                  iVar14 = iVar14 - iVar12;
                  root_table[uVar19 + (long)iVar23] =
                       (HuffmanCode)((uint)uVar1 << 0x10 | (uint)uVar22 & 0xff);
                  uVar27 = 1 << ((char)uVar22 - 1U & 0x1f);
                } while (0 < iVar14);
                do {
                  uVar9 = uVar27;
                  uVar27 = uVar9 >> 1;
                } while ((uVar9 & (uint)uVar19) != 0);
                lVar20 = lVar20 + 1;
                uVar19 = (ulong)(((uint)uVar19 & uVar9 - 1) + uVar9);
                bVar2 = 1 < iVar24;
                iVar24 = iVar24 + -1;
              } while (bVar2);
              iVar24 = 0;
            }
            *(int *)(local_b8 + uVar22 * 4) = iVar24;
          }
          iVar31 = iVar31 + iVar8 * 2;
          uVar22 = uVar22 + 1;
          iVar12 = iVar12 * 2;
          iVar8 = iVar11;
        } while (uVar22 != root_bits + 1);
      }
      iVar12 = iVar6;
      if (root_bits < 0xf) {
        uVar9 = iVar6 - 1;
        local_f4 = root_bits + 1;
        local_d0 = (long)root_bits + 2;
        uVar27 = 0xffffffff;
        iVar8 = 2;
        lVar16 = (long)root_bits;
        pHVar17 = root_table;
        do {
          iVar24 = iVar11 * 2 - *(int *)(local_b8 + lVar16 * 4 + 4);
          if (iVar24 < 0) goto LAB_0012f3da;
          lVar21 = lVar16 + 1;
          if ((root_table != (HuffmanCode *)0x0) && (0 < *(int *)(local_b8 + lVar21 * 4))) {
            uVar25 = (int)lVar21 - root_bits;
            lVar20 = (long)(int)lVar20;
            do {
              uVar28 = (uint)uVar19;
              uVar26 = uVar28 & uVar9;
              if (uVar26 != uVar27) {
                uVar13 = (uint8_t)lVar21;
                lVar30 = local_d0;
                iVar23 = 1 << ((byte)uVar25 & 0x1f);
                iVar14 = local_f4;
                if (lVar16 != 0xe) {
                  do {
                    uVar13 = (uint8_t)iVar14;
                    iVar18 = iVar23 - (&iStack_bc)[lVar30];
                    if (iVar18 == 0 || iVar23 < (&iStack_bc)[lVar30]) goto LAB_0012f77b;
                    iVar29 = (int)lVar30;
                    lVar30 = lVar30 + 1;
                    iVar23 = iVar18 * 2;
                    iVar14 = iVar14 + 1;
                  } while (iVar29 != 0xf);
                  uVar13 = '\x0f';
                }
LAB_0012f77b:
                pHVar17 = pHVar17 + iVar6;
                iVar6 = 1 << (uVar13 - bVar10 & 0x1f);
                iVar12 = iVar12 + iVar6;
                root_table[uVar26].bits = uVar13;
                root_table[uVar26].value =
                     (short)((uint)((int)pHVar17 - (int)root_table) >> 2) - (short)uVar26;
                uVar27 = uVar26;
              }
              uVar1 = sorted[lVar20];
              iVar14 = iVar6;
              do {
                iVar23 = iVar14 - iVar8;
                iVar14 = iVar14 - iVar8;
                pHVar17[(ulong)(uVar28 >> (bVar10 & 0x1f)) + (long)iVar23] =
                     (HuffmanCode)((uint)uVar1 * 0x10000 + (uVar25 & 0xff));
                uVar26 = 1 << ((byte)lVar16 & 0x1f);
              } while (0 < iVar14);
              do {
                uVar15 = uVar26;
                uVar26 = uVar15 >> 1;
              } while ((uVar15 & uVar28) != 0);
              lVar20 = lVar20 + 1;
              uVar19 = (ulong)((uVar28 & uVar15 - 1) + uVar15);
              iVar14 = *(int *)(local_b8 + lVar21 * 4);
              *(int *)(local_b8 + lVar21 * 4) = iVar14 + -1;
            } while (1 < iVar14);
          }
          iVar31 = iVar31 + iVar11 * 2;
          iVar8 = iVar8 * 2;
          local_f4 = local_f4 + 1;
          local_d0 = local_d0 + 1;
          lVar16 = lVar21;
          iVar11 = iVar24;
        } while (lVar21 != 0xf);
      }
      iVar6 = 0;
      if (iVar31 == aiStack_78[0xf] * 2 + -1) {
        iVar6 = iVar12;
      }
    }
  }
  return iVar6;
}

Assistant:

static int BuildHuffmanTable(HuffmanCode* const root_table, int root_bits,
                             const int code_lengths[], int code_lengths_size,
                             uint16_t sorted[]) {
  HuffmanCode* table = root_table;  // next available space in table
  int total_size = 1 << root_bits;  // total size root table + 2nd level table
  int len;                          // current code length
  int symbol;                       // symbol index in original or sorted table
  // number of codes of each length:
  int count[MAX_ALLOWED_CODE_LENGTH + 1] = { 0 };
  // offsets in sorted table for each length:
  int offset[MAX_ALLOWED_CODE_LENGTH + 1];

  assert(code_lengths_size != 0);
  assert(code_lengths != NULL);
  assert((root_table != NULL && sorted != NULL) ||
         (root_table == NULL && sorted == NULL));
  assert(root_bits > 0);

  // Build histogram of code lengths.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    if (code_lengths[symbol] > MAX_ALLOWED_CODE_LENGTH) {
      return 0;
    }
    ++count[code_lengths[symbol]];
  }

  // Error, all code lengths are zeros.
  if (count[0] == code_lengths_size) {
    return 0;
  }

  // Generate offsets into sorted symbol table by code length.
  offset[1] = 0;
  for (len = 1; len < MAX_ALLOWED_CODE_LENGTH; ++len) {
    if (count[len] > (1 << len)) {
      return 0;
    }
    offset[len + 1] = offset[len] + count[len];
  }

  // Sort symbols by length, by symbol order within each length.
  for (symbol = 0; symbol < code_lengths_size; ++symbol) {
    const int symbol_code_length = code_lengths[symbol];
    if (code_lengths[symbol] > 0) {
      if (sorted != NULL) {
        sorted[offset[symbol_code_length]++] = symbol;
      } else {
        offset[symbol_code_length]++;
      }
    }
  }

  // Special case code with only one value.
  if (offset[MAX_ALLOWED_CODE_LENGTH] == 1) {
    if (sorted != NULL) {
      HuffmanCode code;
      code.bits = 0;
      code.value = (uint16_t)sorted[0];
      ReplicateValue(table, 1, total_size, code);
    }
    return total_size;
  }

  {
    int step;              // step size to replicate values in current table
    uint32_t low = -1;     // low bits for current root entry
    uint32_t mask = total_size - 1;    // mask for low bits
    uint32_t key = 0;      // reversed prefix code
    int num_nodes = 1;     // number of Huffman tree nodes
    int num_open = 1;      // number of open branches in current tree level
    int table_bits = root_bits;        // key length of current table
    int table_size = 1 << table_bits;  // size of current table
    symbol = 0;
    // Fill in root table.
    for (len = 1, step = 2; len <= root_bits; ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        code.bits = (uint8_t)len;
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Fill in 2nd level tables and add pointers to root table.
    for (len = root_bits + 1, step = 2; len <= MAX_ALLOWED_CODE_LENGTH;
         ++len, step <<= 1) {
      num_open <<= 1;
      num_nodes += num_open;
      num_open -= count[len];
      if (num_open < 0) {
        return 0;
      }
      if (root_table == NULL) continue;
      for (; count[len] > 0; --count[len]) {
        HuffmanCode code;
        if ((key & mask) != low) {
          table += table_size;
          table_bits = NextTableBitSize(count, len, root_bits);
          table_size = 1 << table_bits;
          total_size += table_size;
          low = key & mask;
          root_table[low].bits = (uint8_t)(table_bits + root_bits);
          root_table[low].value = (uint16_t)((table - root_table) - low);
        }
        code.bits = (uint8_t)(len - root_bits);
        code.value = (uint16_t)sorted[symbol++];
        ReplicateValue(&table[key >> root_bits], step, table_size, code);
        key = GetNextKey(key, len);
      }
    }

    // Check if tree is full.
    if (num_nodes != 2 * offset[MAX_ALLOWED_CODE_LENGTH] - 1) {
      return 0;
    }
  }

  return total_size;
}